

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O0

void quicly_sendbuf_shift(quicly_stream_t *stream,quicly_sendbuf_t *sb,size_t delta)

{
  long *plVar1;
  ulong in_RDX;
  long *in_RSI;
  size_t bytes_in_first_vec;
  quicly_sendbuf_vec_t *first_vec;
  size_t i;
  quicly_stream_t *in_stack_ffffffffffffffc8;
  ulong local_20;
  ulong local_18;
  
  local_20 = 0;
  local_18 = in_RDX;
  do {
    if (local_18 == 0) {
LAB_001545ca:
      if (local_20 != 0) {
        if (in_RSI[1] == local_20) {
          free((void *)*in_RSI);
          *in_RSI = 0;
          in_RSI[1] = 0;
          in_RSI[2] = 0;
        }
        else {
          memmove((void *)*in_RSI,(void *)(*in_RSI + local_20 * 0x18),(in_RSI[1] - local_20) * 0x18)
          ;
          in_RSI[1] = in_RSI[1] - local_20;
        }
      }
      quicly_stream_sync_sendbuf(in_stack_ffffffffffffffc8,0);
      return;
    }
    if ((ulong)in_RSI[1] <= local_20) {
      __assert_fail("i < sb->vecs.size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                    ,0x3a,"void quicly_sendbuf_shift(quicly_stream_t *, quicly_sendbuf_t *, size_t)"
                   );
    }
    plVar1 = (long *)(*in_RSI + local_20 * 0x18);
    if (local_18 < (ulong)(plVar1[1] - in_RSI[3])) {
      in_RSI[3] = local_18 + in_RSI[3];
      goto LAB_001545ca;
    }
    local_18 = local_18 - (plVar1[1] - in_RSI[3]);
    if (*(long *)(*plVar1 + 8) != 0) {
      (**(code **)(*plVar1 + 8))(plVar1);
    }
    in_RSI[3] = 0;
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void quicly_sendbuf_shift(quicly_stream_t *stream, quicly_sendbuf_t *sb, size_t delta)
{
    size_t i;

    for (i = 0; delta != 0; ++i) {
        assert(i < sb->vecs.size);
        quicly_sendbuf_vec_t *first_vec = sb->vecs.entries + i;
        size_t bytes_in_first_vec = first_vec->len - sb->off_in_first_vec;
        if (delta < bytes_in_first_vec) {
            sb->off_in_first_vec += delta;
            break;
        }
        delta -= bytes_in_first_vec;
        if (first_vec->cb->discard_vec != NULL)
            first_vec->cb->discard_vec(first_vec);
        sb->off_in_first_vec = 0;
    }
    if (i != 0) {
        if (sb->vecs.size != i) {
            memmove(sb->vecs.entries, sb->vecs.entries + i, (sb->vecs.size - i) * sizeof(*sb->vecs.entries));
            sb->vecs.size -= i;
        } else {
            free(sb->vecs.entries);
            sb->vecs.entries = NULL;
            sb->vecs.size = 0;
            sb->vecs.capacity = 0;
        }
    }
    quicly_stream_sync_sendbuf(stream, 0);
}